

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O0

_Bool ralloc_vasprintf_rewrite_tail(char **str,size_t *start,char *fmt,__va_list_tag *args)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *ptr;
  size_t new_length;
  __va_list_tag *args_local;
  char *fmt_local;
  size_t *start_local;
  char **str_local;
  
  if (str != (char **)0x0) {
    if (*str == (char *)0x0) {
      pcVar1 = ralloc_vasprintf((void *)0x0,fmt,args);
      *str = pcVar1;
      sVar2 = strlen(*str);
      *start = sVar2;
      str_local._7_1_ = true;
    }
    else {
      sVar3 = printf_length(fmt,args);
      pcVar1 = (char *)resize(*str,*start + sVar3 + 1);
      if (pcVar1 == (char *)0x0) {
        str_local._7_1_ = false;
      }
      else {
        vsnprintf(pcVar1 + *start,sVar3 + 1,fmt,args);
        *str = pcVar1;
        *start = sVar3 + *start;
        str_local._7_1_ = true;
      }
    }
    return str_local._7_1_;
  }
  __assert_fail("str != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                ,0x21d,
                "_Bool ralloc_vasprintf_rewrite_tail(char **, size_t *, const char *, struct __va_list_tag *)"
               );
}

Assistant:

bool
ralloc_vasprintf_rewrite_tail(char **str, size_t *start, const char *fmt,
			      va_list args)
{
   size_t new_length;
   char *ptr;

   assert(str != NULL);

   if (unlikely(*str == NULL)) {
      // Assuming a NULL context is probably bad, but it's expected behavior.
      *str = ralloc_vasprintf(NULL, fmt, args);
      *start = strlen(*str);
      return true;
   }

   new_length = printf_length(fmt, args);

   ptr = resize(*str, *start + new_length + 1);
   if (unlikely(ptr == NULL))
      return false;

   vsnprintf(ptr + *start, new_length + 1, fmt, args);
   *str = ptr;
   *start += new_length;
   return true;
}